

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::adjust_spec_diffusion_fluxes(PeleLM *this,MultiFab **flux,MultiFab *S,BCRec *bc)

{
  bool bVar1;
  FabType FVar2;
  BoxArray *pBVar3;
  undefined8 *in_RCX;
  long lVar4;
  Print *this_00;
  long in_RDI;
  Real run_time;
  int IOProc;
  Array4<const_double> *areafrac_d;
  Array4<double> *rhoYed_d;
  Box result_1;
  Box result;
  EBCellFlagFab *flags;
  EBFArrayBox *state_fab;
  Array4<double> *flux_dir;
  Array4<const_double> *rhoY;
  Box bx;
  Box *edomain;
  Box *ebx;
  int dir;
  MFIter mfi;
  BoxArray *ba;
  int idim;
  int nghost;
  int in_stack_00000b30;
  Geometry *in_stack_00000b38;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00000b40;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bc;
  Box *domain;
  Real strt_time;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff358;
  int iVar5;
  MFIter *mfi_00;
  AmrLevel *in_stack_fffffffffffff360;
  FabArray<amrex::FArrayBox> *this_01;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff370;
  undefined1 in_stack_fffffffffffff387;
  FabArrayBase *in_stack_fffffffffffff388;
  Print *in_stack_fffffffffffff390;
  long *local_c60;
  anon_class_320_7_6be6e399 *in_stack_fffffffffffff3a8;
  Box *in_stack_fffffffffffff3b0;
  undefined8 in_stack_fffffffffffff3c8;
  Print *in_stack_fffffffffffff3d0;
  undefined8 in_stack_fffffffffffff3e0;
  undefined8 in_stack_fffffffffffff3e8;
  NavierStokesBase *in_stack_fffffffffffff3f0;
  undefined1 *puVar6;
  long *local_ba0;
  Box *in_stack_fffffffffffff480;
  EBCellFlagFab *in_stack_fffffffffffff488;
  double local_9f8;
  int local_9ec;
  int local_9e8;
  undefined1 auStack_9e0 [64];
  undefined1 auStack_9a0 [64];
  undefined1 auStack_960 [64];
  undefined1 auStack_920 [64];
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined4 local_8c8;
  undefined8 local_8c4;
  undefined8 local_8bc;
  undefined8 local_8b4;
  undefined1 local_8a8 [64];
  undefined1 *local_868;
  undefined1 local_860 [64];
  undefined1 *local_820;
  int local_818;
  undefined1 auStack_810 [64];
  undefined1 auStack_7d0 [64];
  undefined8 local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined4 local_778;
  undefined8 local_774;
  undefined8 local_76c;
  undefined8 local_764;
  undefined1 local_758 [16];
  int local_748 [2];
  IndexType local_740;
  undefined1 local_73c [16];
  int local_72c [2];
  IndexType local_724;
  EBCellFlagFab *local_720;
  EBFArrayBox *local_718;
  undefined1 local_710 [64];
  undefined1 *local_6d0;
  undefined1 local_6c8 [64];
  undefined1 *local_688;
  undefined8 local_67c;
  undefined8 local_674;
  undefined8 local_66c;
  uint local_664;
  undefined8 *local_660;
  undefined1 local_654 [40];
  int local_62c;
  MFIter local_628;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  BoxArray *local_598;
  int local_590;
  int local_58c;
  long local_588 [72];
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  MultiFab *in_stack_fffffffffffffcc0;
  MultiFab *in_stack_fffffffffffffcc8;
  MultiFab *in_stack_fffffffffffffcd0;
  MultiFab *in_stack_fffffffffffffcd8;
  long alStack_108 [7];
  undefined1 local_d0 [188];
  int local_14;
  uint *local_10;
  int local_8;
  int local_4;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff3e0 >> 0x20);
  local_d0._40_8_ = in_RCX;
  local_d0._32_8_ = amrex::ParallelDescriptor::second();
  local_d0._24_8_ = amrex::Geometry::Domain((Geometry *)(in_RDI + 0x10));
  std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x501a43);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff360,
             (size_type)in_stack_fffffffffffff358,(allocator_type *)0x501a5d);
  std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x501a6c);
  NavierStokesBase::fetchBCArray
            (in_stack_fffffffffffff3f0,(int)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
             (int)in_stack_fffffffffffff3e8,iVar5);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff360,
             in_stack_fffffffffffff358);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x501ab3);
  local_ba0 = local_588;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff360);
    local_ba0 = local_ba0 + 0x30;
  } while (local_ba0 != alStack_108);
  local_58c = 4;
  for (local_590 = 0; iVar5 = (int)((ulong)in_stack_fffffffffffff358 >> 0x20), local_590 < 3;
      local_590 = local_590 + 1) {
    pBVar3 = amrex::AmrLevel::getEdgeBoxArray(in_stack_fffffffffffff360,iVar5);
    iVar5 = local_58c;
    lVar4 = (long)local_590;
    local_5b8 = 0;
    uStack_5b0 = 0;
    local_5c8 = 0;
    uStack_5c0 = 0;
    local_5a8 = 0;
    local_598 = pBVar3;
    amrex::MFInfo::MFInfo((MFInfo *)0x501be0);
    in_stack_fffffffffffff358 =
         (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
         amrex::AmrLevel::Factory(in_stack_fffffffffffff360);
    (**(code **)(local_588[lVar4 * 0x30] + 0x10))
              (local_588 + lVar4 * 0x30,pBVar3,in_RDI + 0x140,0x15,iVar5,&local_5c8);
    amrex::MFInfo::~MFInfo((MFInfo *)0x501c48);
  }
  this_00 = (Print *)(in_RDI + 0x10);
  this_01 = (FabArray<amrex::FArrayBox> *)local_d0;
  mfi_00 = (MFIter *)CONCAT44(iVar5,0x15);
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,
             in_stack_00000b30,in_stack_00000b38,in_stack_00000b40);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)in_stack_fffffffffffff390,in_stack_fffffffffffff388,
             (bool)in_stack_fffffffffffff387);
  while (bVar1 = amrex::MFIter::isValid(&local_628), bVar1) {
    for (local_62c = 0; local_62c < 3; local_62c = local_62c + 1) {
      amrex::MFIter::nodaltilebox
                ((MFIter *)in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20)
                );
      local_654._28_8_ = local_654;
      local_d0._80_8_ = local_d0._24_8_;
      local_d0._76_4_ = local_62c;
      local_67c = *(undefined8 *)local_d0._24_8_;
      local_674 = *(undefined8 *)(local_d0._24_8_ + 8);
      local_66c = *(undefined8 *)(local_d0._24_8_ + 0x10);
      local_664 = ((IndexType *)(local_d0._24_8_ + 0x18))->itype;
      local_d0._128_8_ = &local_67c;
      local_d0._124_4_ = local_62c;
      local_d0._144_8_ = &local_664;
      local_d0._140_4_ = local_62c;
      local_14 = local_62c;
      local_8 = local_62c;
      if ((local_664 & 1 << ((byte)local_62c & 0x1f)) == 0) {
        lVar4 = (long)&local_674 + 4;
        local_d0._156_4_ = local_62c;
        local_d0._152_4_ = 1;
        *(int *)(lVar4 + (long)local_62c * 4) = *(int *)(lVar4 + (long)local_62c * 4) + 1;
        local_d0._176_8_ = &local_664;
        local_d0._172_4_ = local_62c;
        local_4 = local_62c;
        local_664 = 1 << ((byte)local_62c & 0x1f) | local_664;
        local_d0._160_8_ = lVar4;
      }
      local_660 = &local_67c;
      puVar6 = local_6c8;
      local_10 = (uint *)local_d0._144_8_;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff370,(MFIter *)this_01,(int)((ulong)this_00 >> 0x20));
      local_688 = puVar6;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this_01,(MFIter *)this_00);
      local_6d0 = local_710;
      local_718 = (EBFArrayBox *)
                  amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)this_00,mfi_00);
      local_720 = amrex::EBFArrayBox::getEBCellFlagFab(local_718);
      local_d0._112_8_ = local_654._28_8_;
      local_d0._108_4_ = 0;
      local_73c._0_8_ = *(undefined8 *)local_654._28_8_;
      local_73c._8_8_ = *(FabArrayBase **)(local_654._28_8_ + 8);
      local_72c = *(int (*) [2])((IntVect *)(local_654._28_8_ + 0x10))->vect;
      local_724.itype = *(uint *)(local_654._28_8_ + 0x18);
      amrex::Box::grow((Box *)local_73c,0);
      FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffff488,in_stack_fffffffffffff480);
      if (FVar2 != covered) {
        local_d0._96_8_ = local_654._28_8_;
        local_d0._92_4_ = local_58c;
        local_758._0_8_ = *(undefined8 *)local_654._28_8_;
        local_758._8_8_ = *(FabArrayBase **)(local_654._28_8_ + 8);
        local_748 = *(int (*) [2])((IntVect *)(local_654._28_8_ + 0x10))->vect;
        local_740.itype = *(uint *)(local_654._28_8_ + 0x18);
        amrex::Box::grow((Box *)local_758,local_58c);
        FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        if (FVar2 == regular) {
          local_818 = local_62c;
          memcpy(auStack_810,local_688,0x3c);
          memcpy(auStack_7d0,local_6d0,0x3c);
          local_790 = *local_660;
          local_788 = local_660[1];
          local_780 = local_660[2];
          local_778 = *(undefined4 *)(local_660 + 3);
          local_774 = *(undefined8 *)local_d0._40_8_;
          local_76c = *(undefined8 *)(local_d0._40_8_ + 8);
          local_764 = *(undefined8 *)(local_d0._40_8_ + 0x10);
          amrex::
          ParallelFor<PeleLM::adjust_spec_diffusion_fluxes(amrex::MultiFab*const*,amrex::MultiFab_const&,amrex::BCRec_const&)::__0>
                    (in_stack_fffffffffffff3b0,
                     (anon_class_192_5_96485deb *)in_stack_fffffffffffff3a8);
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this_01,(MFIter *)this_00);
          local_820 = local_860;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)this_00,(size_type)mfi_00);
          amrex::MultiCutFab::array((MultiCutFab *)this_00,mfi_00);
          local_868 = local_8a8;
          local_9e8 = local_62c;
          in_stack_fffffffffffff3d0 = (Print *)local_654._28_8_;
          memcpy(auStack_9e0,local_688,0x3c);
          memcpy(auStack_9a0,local_6d0,0x3c);
          memcpy(auStack_960,local_820,0x3c);
          memcpy(auStack_920,local_868,0x3c);
          local_8e0 = *local_660;
          local_8d8 = local_660[1];
          local_8d0 = local_660[2];
          local_8c8 = *(undefined4 *)(local_660 + 3);
          local_8c4 = *(undefined8 *)local_d0._40_8_;
          local_8bc = *(undefined8 *)(local_d0._40_8_ + 8);
          local_8b4 = *(undefined8 *)(local_d0._40_8_ + 0x10);
          amrex::
          ParallelFor<PeleLM::adjust_spec_diffusion_fluxes(amrex::MultiFab*const*,amrex::MultiFab_const&,amrex::BCRec_const&)::__1>
                    (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
        }
      }
    }
    amrex::MFIter::operator++(&local_628);
  }
  amrex::MFIter::~MFIter((MFIter *)this_00);
  if (2 < NavierStokesBase::verbose) {
    local_9ec = amrex::ParallelDescriptor::IOProcessorNumber();
    local_9f8 = amrex::ParallelDescriptor::second();
    local_9f8 = local_9f8 - (double)local_d0._32_8_;
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_9f8,local_9ec);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff390,(ostream *)in_stack_fffffffffffff388);
    amrex::Print::operator<<(this_00,(char (*) [52])mfi_00);
    amrex::Print::operator<<(this_00,(int *)mfi_00);
    amrex::Print::operator<<(this_00,(char (*) [9])mfi_00);
    amrex::Print::operator<<(this_00,(double *)mfi_00);
    amrex::Print::operator<<(this_00,(char *)mfi_00);
    amrex::Print::~Print(in_stack_fffffffffffff3d0);
  }
  local_c60 = alStack_108;
  do {
    local_c60 = local_c60 + -0x30;
    amrex::MultiFab::~MultiFab((MultiFab *)0x502558);
  } while (local_c60 != local_588);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x502579);
  return;
}

Assistant:

void
PeleLM::adjust_spec_diffusion_fluxes (MultiFab* const * flux,
                                      const MultiFab&   S,
                                      const BCRec&      bc)
{
   BL_PROFILE("PLM::adjust_spec_diffusion_fluxes()");
   AMREX_ASSERT(S.nGrow() >= 1);
   // Note: S first entry is rho

   //
   // Adjust the species diffusion fluxes so that their sum is zero.
   //
   const Real strt_time = ParallelDescriptor::second();
   const Box& domain = geom.Domain();

#ifdef AMREX_USE_EB
   Vector<BCRec> math_bc(NUM_SPECIES);
   math_bc = fetchBCArray(State_Type,first_spec,NUM_SPECIES);

   MultiFab edgstate[AMREX_SPACEDIM];
   int nghost(4);         // TODO Use 4 for now

   for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
   {
     const BoxArray& ba = getEdgeBoxArray(idim);
     edgstate[idim].define(ba, dmap, NUM_SPECIES, nghost, MFInfo(), Factory());
   }
   EB_interp_CellCentroid_to_FaceCentroid(S, AMREX_D_DECL(edgstate[0],edgstate[1],edgstate[2]), 1, 0, NUM_SPECIES, geom, math_bc);
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      for (int dir =0; dir < AMREX_SPACEDIM; ++dir)
      {
         const Box& ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         auto const& rhoY     = S.const_array(mfi,1);
         auto const& flux_dir = flux[dir]->array(mfi);

#ifdef AMREX_USE_EB
         const EBFArrayBox&  state_fab = static_cast<EBFArrayBox const&>(S[mfi]);
         const EBCellFlagFab&    flags = state_fab.getEBCellFlagFab();

         if (flags.getType(amrex::grow(ebx,0)) != FabType::covered )
         {
            // No cut cells in tile + nghost-cell witdh halo -> use non-eb routine
            if (flags.getType(amrex::grow(ebx,nghost)) == FabType::regular )
            {
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
               });
            }
            else
            {
               auto const& rhoYed_d   = edgstate[dir].array(mfi);
               auto const& areafrac_d = areafrac[dir]->array(mfi);
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, rhoYed_d, areafrac_d, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux_eb( i, j, k, dir, on_lo, on_hi, rhoY, rhoYed_d, areafrac_d, flux_dir );
               });
            }
         }
#else
         amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
         });

#endif
      }
   }

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::adjust_spec_diffusion_fluxes(): lev: " << level
                     << ", time: " << run_time << '\n';
   }
}